

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O0

void __thiscall Sequence::read_files(Sequence *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  ulong uVar4;
  element_type *peVar5;
  element_type *peVar6;
  reference pvVar7;
  __shared_ptr *this_00;
  __shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *this_01;
  float fVar11;
  shared_ptr<Array> local_88;
  shared_ptr<Array> local_78;
  shared_ptr<Array> local_68;
  int local_58;
  int local_54;
  int sup;
  int maxitemsup;
  undefined1 local_30 [24];
  unsigned_long capacity;
  Sequence *pSStack_10;
  int i;
  Sequence *this_local;
  
  pSStack_10 = this;
  peVar3 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->args);
  fVar11 = peVar3->avg_trans_count * 30.0;
  uVar4 = (ulong)fVar11;
  local_30._16_8_ = uVar4 | (long)(fVar11 - 9.223372e+18) & (long)uVar4 >> 0x3f;
  peVar5 = std::
           __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->numLargeItemset);
  std::vector<int,_std::allocator<int>_>::clear(peVar5);
  peVar5 = std::
           __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->numLargeItemset);
  std::vector<int,_std::allocator<int>_>::resize(peVar5,local_30._16_8_);
  peVar6 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->invdb);
  iVar2 = InvertDatabase::make_l1_pass(peVar6);
  peVar5 = std::
           __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->numLargeItemset);
  pvVar7 = std::vector<int,_std::allocator<int>_>::at(peVar5,0);
  *pvVar7 = iVar2;
  peVar3 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->args);
  if (peVar3->ext_l2_pass == 0) {
    iVar2 = get_file_l2(this);
    peVar5 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->numLargeItemset);
    pvVar7 = std::vector<int,_std::allocator<int>_>::at(peVar5,1);
    *pvVar7 = iVar2;
  }
  else {
    peVar6 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->invdb);
    iVar2 = InvertDatabase::make_l2_pass(peVar6);
    peVar5 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->numLargeItemset);
    pvVar7 = std::vector<int,_std::allocator<int>_>::at(peVar5,1);
    *pvVar7 = iVar2;
  }
  for (capacity._4_4_ = 0; iVar2 = capacity._4_4_,
      peVar3 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->args), iVar2 < peVar3->dbase_max_item;
      capacity._4_4_ = capacity._4_4_ + 1) {
    peVar6 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->invdb);
    this_00 = (__shared_ptr *)InvertDatabase::get_eqgraph_item(peVar6,capacity._4_4_);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      peVar6 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->invdb);
      p_Var8 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               InvertDatabase::get_eqgraph_item(peVar6,capacity._4_4_);
      peVar9 = std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var8);
      iVar2 = EqGrNode::num_elements(peVar9);
      if (0 < iVar2) {
        peVar6 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->invdb);
        p_Var8 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 InvertDatabase::get_eqgraph_item(peVar6,capacity._4_4_);
        std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  (p_Var8);
        EqGrNode::elements((EqGrNode *)local_30);
        peVar10 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                             )local_30);
        Array::compact(peVar10);
        std::shared_ptr<Array>::~shared_ptr((shared_ptr<Array> *)local_30);
      }
      peVar6 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->invdb);
      p_Var8 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               InvertDatabase::get_eqgraph_item(peVar6,capacity._4_4_);
      peVar9 = std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var8);
      iVar2 = EqGrNode::seqnum_elements(peVar9);
      if (0 < iVar2) {
        peVar6 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->invdb);
        p_Var8 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 InvertDatabase::get_eqgraph_item(peVar6,capacity._4_4_);
        std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  (p_Var8);
        EqGrNode::seqelements((EqGrNode *)&sup);
        peVar10 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                             )&sup);
        Array::compact(peVar10);
        std::shared_ptr<Array>::~shared_ptr((shared_ptr<Array> *)&sup);
      }
    }
  }
  local_54 = 0;
  for (capacity._4_4_ = 0; iVar2 = capacity._4_4_,
      peVar3 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->args), iVar2 < peVar3->dbase_max_item;
      capacity._4_4_ = capacity._4_4_ + 1) {
    this_01 = std::__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )&this->partition);
    local_58 = Partition::partition_get_idxsup(this_01,capacity._4_4_);
    if (local_54 < local_58) {
      local_54 = local_58;
    }
  }
  std::make_shared<Array,int&>((int *)&local_68);
  std::shared_ptr<Array>::operator=(&this->l_array,&local_68);
  std::shared_ptr<Array>::~shared_ptr(&local_68);
  std::make_shared<Array,int&>((int *)&local_78);
  std::shared_ptr<Array>::operator=(&this->e_array,&local_78);
  std::shared_ptr<Array>::~shared_ptr(&local_78);
  std::make_shared<Array,int&>((int *)&local_88);
  std::shared_ptr<Array>::operator=(&this->m_array,&local_88);
  std::shared_ptr<Array>::~shared_ptr(&local_88);
  return;
}

Assistant:

void Sequence::read_files() {
    int i;
    auto capacity = static_cast<unsigned long>(args->avg_trans_count * 30);

    numLargeItemset->clear();
    numLargeItemset->resize(capacity);

    numLargeItemset->at(0) = invdb->make_l1_pass();

    if (args->ext_l2_pass) {
        numLargeItemset->at(1) = invdb->make_l2_pass();
    } else {
        numLargeItemset->at(1) = get_file_l2();
    }

    for (i = 0; i < args->dbase_max_item; i++) {
        if (invdb->get_eqgraph_item(i)) {
            if (invdb->get_eqgraph_item(i)->num_elements() > 0)
                invdb->get_eqgraph_item(i)->elements()->compact();
            if (invdb->get_eqgraph_item(i)->seqnum_elements() > 0)
                invdb->get_eqgraph_item(i)->seqelements()->compact();
        }
    }

    int maxitemsup = 0;
    int sup;
    for (i = 0; i < args->dbase_max_item; i++) {
        sup = partition->partition_get_idxsup(i);
        if (maxitemsup < sup) maxitemsup = sup;
    }
    l_array = make_shared<Array>(maxitemsup);
    e_array = make_shared<Array>(maxitemsup);
    m_array = make_shared<Array>(maxitemsup);
}